

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O0

uint8_t * VP8DecompressAlphaRows(VP8Decoder *dec,VP8Io *io,int row,int num_rows)

{
  int iVar1;
  ALPHDecoder *pAVar2;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  VP8Io *unaff_retaddr;
  uint8_t *alpha;
  int height;
  int width;
  int in_stack_00000038;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000044;
  uint8_t *in_stack_00000048;
  VP8Io *in_stack_ffffffffffffffd0;
  int iVar3;
  VP8Decoder *in_stack_fffffffffffffff8;
  
  iVar3 = *in_RSI;
  iVar1 = in_RSI[0x21];
  if (((in_EDX < 0) || (in_ECX < 1)) || (iVar1 < in_EDX + in_ECX)) {
    return (uint8_t *)0x0;
  }
  if (*(int *)(in_RDI + 0xba8) == 0) {
    if (*(long *)(in_RDI + 0xb90) == 0) {
      pAVar2 = ALPHNew();
      *(ALPHDecoder **)(in_RDI + 0xb90) = pAVar2;
      if (*(long *)(in_RDI + 0xb90) == 0) {
        return (uint8_t *)0x0;
      }
      iVar1 = AllocateAlphaPlane((VP8Decoder *)CONCAT44(iVar3,iVar1),in_stack_ffffffffffffffd0);
      if ((iVar1 == 0) ||
         (iVar1 = ALPHInit((ALPHDecoder *)CONCAT44(row,num_rows),_height,(size_t)alpha,unaff_retaddr
                           ,(uint8_t *)in_stack_fffffffffffffff8), iVar1 == 0)) goto LAB_0015eb7d;
      if (*(int *)(*(long *)(in_RDI + 0xb90) + 0x10) != 1) {
        *(undefined4 *)(in_RDI + 0xbc8) = 0;
      }
    }
    iVar1 = ALPHDecode(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    if (iVar1 == 0) {
LAB_0015eb7d:
      WebPDeallocateAlphaMemory((VP8Decoder *)0x15eb87);
      return (uint8_t *)0x0;
    }
    if (*(int *)(in_RDI + 0xba8) != 0) {
      ALPHDelete((ALPHDecoder *)0x15eabd);
      *(undefined8 *)(in_RDI + 0xb90) = 0;
      if ((0 < *(int *)(in_RDI + 0xbc8)) &&
         (iVar1 = WebPDequantizeLevels
                            (in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c
                             ,in_stack_00000038), iVar1 == 0)) goto LAB_0015eb7d;
    }
  }
  return (uint8_t *)(*(long *)(in_RDI + 3000) + (long)(in_EDX * iVar3));
}

Assistant:

const uint8_t* VP8DecompressAlphaRows(VP8Decoder* const dec,
                                      const VP8Io* const io,
                                      int row, int num_rows) {
  const int width = io->width;
  const int height = io->crop_bottom;

  assert(dec != NULL && io != NULL);

  if (row < 0 || num_rows <= 0 || row + num_rows > height) {
    return NULL;
  }

  if (!dec->is_alpha_decoded_) {
    if (dec->alph_dec_ == NULL) {    // Initialize decoder.
      dec->alph_dec_ = ALPHNew();
      if (dec->alph_dec_ == NULL) return NULL;
      if (!AllocateAlphaPlane(dec, io)) goto Error;
      if (!ALPHInit(dec->alph_dec_, dec->alpha_data_, dec->alpha_data_size_,
                    io, dec->alpha_plane_)) {
        goto Error;
      }
      // if we allowed use of alpha dithering, check whether it's needed at all
      if (dec->alph_dec_->pre_processing_ != ALPHA_PREPROCESSED_LEVELS) {
        dec->alpha_dithering_ = 0;   // disable dithering
      } else {
        num_rows = height - row;     // decode everything in one pass
      }
    }

    assert(dec->alph_dec_ != NULL);
    assert(row + num_rows <= height);
    if (!ALPHDecode(dec, row, num_rows)) goto Error;

    if (dec->is_alpha_decoded_) {   // finished?
      ALPHDelete(dec->alph_dec_);
      dec->alph_dec_ = NULL;
      if (dec->alpha_dithering_ > 0) {
        uint8_t* const alpha = dec->alpha_plane_ + io->crop_top * width
                             + io->crop_left;
        if (!WebPDequantizeLevels(alpha,
                                  io->crop_right - io->crop_left,
                                  io->crop_bottom - io->crop_top,
                                  width, dec->alpha_dithering_)) {
          goto Error;
        }
      }
    }
  }

  // Return a pointer to the current decoded row.
  return dec->alpha_plane_ + row * width;

 Error:
  WebPDeallocateAlphaMemory(dec);
  return NULL;
}